

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O3

DInterpolation * __thiscall sector_t::SetInterpolation(sector_t *this,int position,bool attach)

{
  int *piVar1;
  uint uVar2;
  DSectorPlaneInterpolation *this_00;
  long lVar3;
  
  lVar3 = (long)position;
  this_00 = *(DSectorPlaneInterpolation **)(this->terrainnum + lVar3 * 2 + 8);
  if (this_00 == (DSectorPlaneInterpolation *)0x0) {
LAB_0051720e:
    switch(position) {
    case 0:
      this_00 = (DSectorPlaneInterpolation *)
                M_Malloc_Dbg(0x80,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                             ,0x1f9);
      DSectorPlaneInterpolation::DSectorPlaneInterpolation
                (this_00,(sector_t_conflict *)this,true,attach);
      break;
    case 1:
      this_00 = (DSectorPlaneInterpolation *)
                M_Malloc_Dbg(0x80,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                             ,0x1f9);
      DSectorPlaneInterpolation::DSectorPlaneInterpolation
                (this_00,(sector_t_conflict *)this,false,attach);
      break;
    case 2:
      this_00 = (DSectorPlaneInterpolation *)
                M_Malloc_Dbg(0x70,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                             ,0x1f9);
      DSectorScrollInterpolation::DSectorScrollInterpolation
                ((DSectorScrollInterpolation *)this_00,(sector_t_conflict *)this,true);
      break;
    case 3:
      this_00 = (DSectorPlaneInterpolation *)
                M_Malloc_Dbg(0x70,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                             ,0x1f9);
      DSectorScrollInterpolation::DSectorScrollInterpolation
                ((DSectorScrollInterpolation *)this_00,(sector_t_conflict *)this,false);
      break;
    default:
      goto switchD_00517227_default;
    }
    *(DSectorPlaneInterpolation **)(this->terrainnum + lVar3 * 2 + 8) = this_00;
    if (this_00 == (DSectorPlaneInterpolation *)0x0) {
      _DAT_00000038 = _DAT_00000038 + 1;
      return (DInterpolation *)0x0;
    }
  }
  else if (((this_00->super_DInterpolation).super_DObject.ObjectFlags & 0x20) != 0) {
    (this->terrainnum + lVar3 * 2 + 8)[0] = 0;
    (this->terrainnum + lVar3 * 2 + 8)[1] = 0;
    goto LAB_0051720e;
  }
  if (((this_00->super_DInterpolation).super_DObject.ObjectFlags & 0x20) == 0) {
    piVar1 = &(this_00->super_DInterpolation).refcount;
    *piVar1 = *piVar1 + 1;
    uVar2 = (this_00->super_DInterpolation).super_DObject.ObjectFlags;
    if ((uVar2 & 0x20) == 0) {
      if ((GC::State == 1) && ((uVar2 & 3) != 0)) {
        GC::Barrier((DObject *)0x0,(DObject *)this_00);
        this_00 = *(DSectorPlaneInterpolation **)(this->terrainnum + lVar3 * 2 + 8);
        if (this_00 == (DSectorPlaneInterpolation *)0x0) {
          return (DInterpolation *)0x0;
        }
      }
      if (((this_00->super_DInterpolation).super_DObject.ObjectFlags & 0x20) == 0) {
        return &this_00->super_DInterpolation;
      }
    }
    (this->terrainnum + lVar3 * 2 + 8)[0] = 0;
    (this->terrainnum + lVar3 * 2 + 8)[1] = 0;
  }
  else {
    (this->terrainnum + lVar3 * 2 + 8)[0] = 0;
    (this->terrainnum + lVar3 * 2 + 8)[1] = 0;
    _DAT_00000038 = _DAT_00000038 + 1;
  }
switchD_00517227_default:
  return (DInterpolation *)0x0;
}

Assistant:

DInterpolation *sector_t::SetInterpolation(int position, bool attach)
{
	if (interpolations[position] == NULL)
	{
		DInterpolation *interp;
		switch (position)
		{
		case sector_t::CeilingMove:
			interp = new DSectorPlaneInterpolation(this, true, attach);
			break;

		case sector_t::FloorMove:
			interp = new DSectorPlaneInterpolation(this, false, attach);
			break;

		case sector_t::CeilingScroll:
			interp = new DSectorScrollInterpolation(this, true);
			break;

		case sector_t::FloorScroll:
			interp = new DSectorScrollInterpolation(this, false);
			break;

		default:
			return NULL;
		}
		interpolations[position] = interp;
	}
	interpolations[position]->AddRef();
	GC::WriteBarrier(interpolations[position]);
	return interpolations[position];
}